

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_path_or_unary_expression(xpath_parser *this)

{
  xpath_lexer *this_00;
  xpath_value_type xVar1;
  xpath_variable_set *this_01;
  char_t *pcVar2;
  bool *pbVar3;
  char cVar4;
  byte bVar5;
  nodetest_t nVar6;
  size_t length;
  byte *pbVar7;
  xpath_ast_node *pxVar8;
  xpath_variable *__dest;
  char_t *pcVar9;
  xpath_ast_node *pxVar10;
  xpath_ast_node *pxVar11;
  xpath_parse_result *pxVar12;
  xpath_ast_node *pxVar13;
  long lVar14;
  bool bVar15;
  lexeme_t lVar16;
  char *pcVar17;
  long lVar18;
  ulong uVar19;
  size_t __n;
  double dVar20;
  xpath_ast_node *args [2];
  bool local_59;
  xpath_ast_node *local_48 [3];
  
  lVar16 = (this->_lexer)._cur_lexeme;
  if (0xc < lVar16 - lex_minus) {
switchD_00111cdc_caseD_9:
    pxVar8 = parse_location_path(this);
    return pxVar8;
  }
  this_00 = &this->_lexer;
  switch(lVar16) {
  case lex_minus:
    xpath_lexer::next(this_00);
    pxVar8 = parse_expression(this,7);
    if (pxVar8 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
    if (pxVar11 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar11->_type = '\x0e';
    pxVar11->_rettype = '\x02';
    pxVar11->_axis = '\0';
    pxVar11->_test = '\0';
    pxVar11->_left = pxVar8;
    pxVar11->_right = (xpath_ast_node *)0x0;
    pxVar11->_next = (xpath_ast_node *)0x0;
    return pxVar11;
  default:
    goto switchD_00111cdc_caseD_9;
  case lex_var_ref:
switchD_00111cdc_caseD_b:
    this_01 = this->_variables;
    if (this_01 == (xpath_variable_set *)0x0) {
      pxVar12 = this->_result;
      pcVar17 = "Unknown variable: variable set is not provided";
    }
    else {
      pcVar2 = (this->_lexer)._cur_lexeme_contents.begin;
      uVar19 = (long)(this->_lexer)._cur_lexeme_contents.end - (long)pcVar2;
      pcVar9 = this->_scratch;
      if ((0x1f < uVar19) &&
         (pcVar9 = (char_t *)
                   (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                             allocate)(uVar19 + 1), pcVar9 == (char_t *)0x0)) {
LAB_00112064:
        pbVar3 = this->_alloc->_error;
        if (pbVar3 != (bool *)0x0) {
          *pbVar3 = true;
          return (xpath_ast_node *)0x0;
        }
        __assert_fail("_alloc->_error",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                      ,0x2b77,
                      "xpath_ast_node *pugi::impl::(anonymous namespace)::xpath_parser::error_oom()"
                     );
      }
      memcpy(pcVar9,pcVar2,uVar19);
      pcVar9[uVar19] = '\0';
      __dest = xpath_variable_set::_find(this_01,pcVar9);
      if (pcVar9 != this->_scratch) {
        (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                  (pcVar9);
      }
      if (__dest != (xpath_variable *)0x0) {
        xpath_lexer::next(this_00);
        xVar1 = __dest->_type;
        pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar10 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        pxVar10->_type = '\x14';
        pxVar10->_rettype = (char)xVar1;
        pxVar10->_axis = '\0';
        pxVar10->_test = '\0';
        goto LAB_00111fa4;
      }
      pxVar12 = this->_result;
      pcVar17 = "Unknown variable: variable set does not contain the given name";
    }
    break;
  case lex_open_brace:
switchD_00111cdc_caseD_c:
    xpath_lexer::next(this_00);
    pxVar10 = parse_expression(this,0);
    if (pxVar10 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    if ((this->_lexer)._cur_lexeme == lex_close_brace) {
      xpath_lexer::next(this_00);
      goto LAB_00111fba;
    }
    pxVar12 = this->_result;
    pcVar17 = "Expected \')\' to match an opening \'(\'";
    break;
  case lex_quoted_string:
switchD_00111cdc_caseD_e:
    pcVar2 = (this->_lexer)._cur_lexeme_contents.begin;
    if (pcVar2 == (char_t *)0x0) {
      __dest = (xpath_variable *)0x118401;
    }
    else {
      __n = (long)(this->_lexer)._cur_lexeme_contents.end - (long)pcVar2;
      __dest = (xpath_variable *)xpath_allocator::allocate(this->_alloc,__n + 1);
      if (__dest == (xpath_variable *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      memcpy(__dest,(this->_lexer)._cur_lexeme_contents.begin,__n);
      *(char *)((long)__dest + __n) = '\0';
    }
    xpath_lexer::next(this_00);
    pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
    if (pxVar10 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar10->_type = '\x12';
    pxVar10->_rettype = '\x03';
    pxVar10->_axis = '\0';
    pxVar10->_test = '\0';
LAB_00111fa4:
    pxVar10->_left = (xpath_ast_node *)0x0;
    pxVar10->_right = (xpath_ast_node *)0x0;
    pxVar10->_next = (xpath_ast_node *)0x0;
    (pxVar10->_data).string = (char_t *)__dest;
    goto LAB_00111fba;
  case lex_number:
switchD_00111cdc_caseD_f:
    pcVar2 = (this->_lexer)._cur_lexeme_contents.begin;
    uVar19 = (long)(this->_lexer)._cur_lexeme_contents.end - (long)pcVar2;
    pcVar9 = this->_scratch;
    if ((0x1f < uVar19) &&
       (pcVar9 = (char_t *)
                 (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                           allocate)(uVar19 + 1), pcVar9 == (char_t *)0x0)) goto LAB_00112064;
    memcpy(pcVar9,pcVar2,uVar19);
    pcVar9[uVar19] = '\0';
    dVar20 = convert_string_to_number(pcVar9);
    if (pcVar9 != this->_scratch) {
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                (pcVar9);
    }
    xpath_lexer::next(this_00);
    pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
    if (pxVar10 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar10->_type = '\x13';
    pxVar10->_rettype = '\x02';
    pxVar10->_axis = '\0';
    pxVar10->_test = '\0';
    pxVar10->_next = (xpath_ast_node *)0x0;
    pxVar10->_left = (xpath_ast_node *)0x0;
    pxVar10->_right = (xpath_ast_node *)0x0;
    (pxVar10->_data).number = dVar20;
    goto LAB_00111fba;
  case lex_string:
    pbVar7 = this_00->_cur;
    do {
      bVar5 = *pbVar7;
      pbVar7 = pbVar7 + 1;
    } while (((anonymous_namespace)::chartype_table[bVar5] & 8) != 0);
    if ((bVar5 != 0x28) ||
       (nVar6 = parse_node_test_type
                          ((xpath_parser *)(this->_lexer)._cur_lexeme_contents.begin,
                           (xpath_lexer_string *)(this->_lexer)._cur_lexeme_contents.end),
       nVar6 != nodetest_none)) goto switchD_00111cdc_caseD_9;
    switch(lVar16) {
    case lex_var_ref:
      goto switchD_00111cdc_caseD_b;
    case lex_open_brace:
      goto switchD_00111cdc_caseD_c;
    default:
      pxVar12 = this->_result;
      pcVar17 = "Unrecognizable primary expression";
      break;
    case lex_quoted_string:
      goto switchD_00111cdc_caseD_e;
    case lex_number:
      goto switchD_00111cdc_caseD_f;
    case lex_string:
      goto switchD_00111d8e_caseD_14;
    }
  }
  goto LAB_00112107;
switchD_00111d8e_caseD_14:
  local_48[0] = (xpath_ast_node *)0x0;
  local_48[1] = (xpath_ast_node *)0x0;
  pcVar2 = (this->_lexer)._cur_lexeme_contents.begin;
  pcVar9 = (this->_lexer)._cur_lexeme_contents.end;
  xpath_lexer::next(this_00);
  if ((this->_lexer)._cur_lexeme != lex_open_brace) {
    pcVar17 = "Unrecognized function call";
    goto switchD_00112213_caseD_64;
  }
  xpath_lexer::next(this_00);
  lVar16 = (this->_lexer)._cur_lexeme;
  uVar19 = 0;
  pxVar8 = (xpath_ast_node *)0x0;
  pxVar11 = (xpath_ast_node *)0x0;
  if (lVar16 != lex_close_brace) {
    uVar19 = 0;
    pxVar10 = (xpath_ast_node *)0x0;
    do {
      if (uVar19 == 0) {
        pxVar13 = parse_expression(this,0);
        if (pxVar13 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
LAB_001121c8:
        local_48[uVar19] = pxVar13;
      }
      else {
        if (lVar16 != lex_comma) {
          pcVar17 = "No comma between function arguments";
          goto switchD_00112213_caseD_64;
        }
        xpath_lexer::next(this_00);
        pxVar13 = parse_expression(this,0);
        if (pxVar13 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        if (uVar19 == 1) goto LAB_001121c8;
        pxVar10->_next = pxVar13;
      }
      lVar16 = (this->_lexer)._cur_lexeme;
      uVar19 = uVar19 + 1;
      pxVar8 = local_48[1];
      pxVar11 = local_48[0];
      pxVar10 = pxVar13;
    } while (lVar16 != lex_close_brace);
  }
  xpath_lexer::next(this_00);
  pcVar17 = "Unrecognized function or wrong parameter count";
  switch(*pcVar2) {
  case 'b':
    lVar14 = (long)pcVar9 - (long)pcVar2;
    if (lVar14 != 0) {
      lVar18 = 0;
      do {
        if ("boolean"[lVar18] != pcVar2[lVar18]) goto switchD_00112213_caseD_64;
        lVar18 = lVar18 + 1;
      } while (lVar14 != lVar18);
    }
    if ((uVar19 != 1) || ("boolean"[lVar14] != '\0')) break;
    pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
    if (pxVar10 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar10->_type = '-';
    pxVar10->_rettype = '\x04';
    pxVar10->_axis = '\0';
    pxVar10->_test = '\0';
LAB_00112519:
    pxVar10->_left = pxVar11;
    goto LAB_00112bec;
  case 'c':
    lVar14 = (long)pcVar9 - (long)pcVar2;
    if (lVar14 != 0) {
      lVar18 = 0;
      do {
        if ("pos == count"[lVar18 + 7] != pcVar2[lVar18]) goto LAB_0011283a;
        lVar18 = lVar18 + 1;
      } while (lVar14 != lVar18);
    }
    if ((uVar19 != 1) || ("pos == count"[lVar14 + 7] != '\0')) {
LAB_0011283a:
      if (pcVar9 != pcVar2) {
        lVar18 = 0;
        do {
          if ("contains"[lVar18] != pcVar2[lVar18]) goto LAB_00112892;
          lVar18 = lVar18 + 1;
        } while (lVar14 != lVar18);
      }
      if ((uVar19 == 2) && ("contains"[lVar14] == '\0')) {
        pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar10 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        pxVar10->_type = '#';
        pxVar10->_rettype = '\x04';
        pxVar10->_axis = '\0';
        pxVar10->_test = '\0';
      }
      else {
LAB_00112892:
        if (pcVar9 != pcVar2) {
          lVar18 = 0;
          do {
            if ("concat"[lVar18] != pcVar2[lVar18]) goto LAB_00112a95;
            lVar18 = lVar18 + 1;
          } while (lVar14 != lVar18);
        }
        if ((uVar19 < 2) || ("concat"[lVar14] != '\0')) {
LAB_00112a95:
          if (pcVar9 != pcVar2) {
            lVar18 = 0;
            do {
              if ("ceiling"[lVar18] != pcVar2[lVar18]) goto switchD_00112213_caseD_64;
              lVar18 = lVar18 + 1;
            } while (lVar14 != lVar18);
          }
          if (uVar19 == 1 && "ceiling"[lVar14] == '\0') {
            pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
            if (pxVar10 == (xpath_ast_node *)0x0) {
              return (xpath_ast_node *)0x0;
            }
            pxVar10->_type = '6';
            pxVar10->_rettype = '\x02';
            pxVar10->_axis = '\0';
            pxVar10->_test = '\0';
            goto LAB_00112be3;
          }
          break;
        }
        pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar10 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        pxVar10->_type = '!';
        pxVar10->_rettype = '\x03';
        pxVar10->_axis = '\0';
        pxVar10->_test = '\0';
      }
LAB_00112d26:
      pxVar10->_left = pxVar11;
LAB_00112d2f:
      pxVar10->_right = pxVar8;
LAB_00112d38:
      pxVar10->_next = (xpath_ast_node *)0x0;
      goto LAB_00111fba;
    }
    if (pxVar11->_rettype != '\x01') goto LAB_00112db4;
    pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
    if (pxVar10 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar10->_type = '\x17';
    pxVar10->_rettype = '\x02';
    pxVar10->_axis = '\0';
    pxVar10->_test = '\0';
    goto LAB_00112be3;
  case 'f':
    lVar14 = (long)pcVar9 - (long)pcVar2;
    if (lVar14 != 0) {
      lVar18 = 0;
      do {
        if ("false"[lVar18] != pcVar2[lVar18]) goto LAB_0011266f;
        lVar18 = lVar18 + 1;
      } while (lVar14 != lVar18);
    }
    if ((uVar19 == 0) && ("false"[lVar14] == '\0')) {
      pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar10 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar10->_type = '0';
      pxVar10->_rettype = '\x04';
      pxVar10->_axis = '\0';
      pxVar10->_test = '\0';
LAB_00112736:
      pxVar10->_left = (xpath_ast_node *)0x0;
      pxVar10->_right = (xpath_ast_node *)0x0;
      goto LAB_00112d38;
    }
LAB_0011266f:
    if (pcVar9 != pcVar2) {
      lVar18 = 0;
      do {
        if ("floor"[lVar18] != pcVar2[lVar18]) goto switchD_00112213_caseD_64;
        lVar18 = lVar18 + 1;
      } while (lVar14 != lVar18);
    }
    if ((uVar19 == 1) && ("floor"[lVar14] == '\0')) {
      pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar10 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar10->_type = '5';
      pxVar10->_rettype = '\x02';
      pxVar10->_axis = '\0';
      pxVar10->_test = '\0';
      goto LAB_00112be3;
    }
    break;
  case 'i':
    lVar14 = (long)pcVar9 - (long)pcVar2;
    if (lVar14 != 0) {
      lVar18 = 0;
      do {
        if ("basic_string::_M_construct null not valid"[lVar18 + 0x27] != pcVar2[lVar18])
        goto switchD_00112213_caseD_64;
        lVar18 = lVar18 + 1;
      } while (lVar14 != lVar18);
    }
    if ((uVar19 == 1) && ("basic_string::_M_construct null not valid"[lVar14 + 0x27] == '\0')) {
      pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar10 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar10->_type = '\x18';
      pxVar10->_rettype = '\x01';
      pxVar10->_axis = '\0';
      pxVar10->_test = '\0';
      goto LAB_00112519;
    }
    break;
  case 'l':
    lVar14 = (long)pcVar9 - (long)pcVar2;
    if (lVar14 != 0) {
      lVar18 = 0;
      do {
        if ("last"[lVar18] != pcVar2[lVar18]) goto LAB_001128fe;
        lVar18 = lVar18 + 1;
      } while (lVar14 != lVar18);
    }
    if ((uVar19 == 0) && ("last"[lVar14] == '\0')) {
      pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar10 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar10->_type = '\x15';
      pxVar10->_rettype = '\x02';
      pxVar10->_axis = '\0';
      pxVar10->_test = '\0';
      goto LAB_00112736;
    }
LAB_001128fe:
    if (pcVar9 != pcVar2) {
      lVar18 = 0;
      do {
        if ("xml:lang"[lVar18 + 4] != pcVar2[lVar18]) goto LAB_00112afe;
        lVar18 = lVar18 + 1;
      } while (lVar14 != lVar18);
    }
    if ((uVar19 != 1) || ("xml:lang"[lVar14 + 4] != '\0')) {
LAB_00112afe:
      if (pcVar9 != pcVar2) {
        lVar18 = 0;
        do {
          if ("local-name"[lVar18] != pcVar2[lVar18]) goto switchD_00112213_caseD_64;
          lVar18 = lVar18 + 1;
        } while (lVar14 != lVar18);
      }
      if ((1 < uVar19) || ("local-name"[lVar14] != '\0')) break;
      if ((uVar19 == 1) && (pxVar11->_rettype != '\x01')) goto LAB_00112db4;
      pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar10 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      cVar4 = '\x1a' - (uVar19 == 0);
      goto LAB_001127bc;
    }
    pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
    if (pxVar10 == (xpath_ast_node *)0x0) {
      return (xpath_ast_node *)0x0;
    }
    pxVar10->_type = '1';
    pxVar10->_rettype = '\x04';
    pxVar10->_axis = '\0';
    pxVar10->_test = '\0';
    goto LAB_00112be3;
  case 'n':
    lVar14 = (long)pcVar9 - (long)pcVar2;
    if (lVar14 != 0) {
      lVar18 = 0;
      do {
        if ("Unknown variable: variable set does not contain the given name"[lVar18 + 0x3a] !=
            pcVar2[lVar18]) goto LAB_0011274c;
        lVar18 = lVar18 + 1;
      } while (lVar14 != lVar18);
    }
    if ((uVar19 < 2) &&
       ("Unknown variable: variable set does not contain the given name"[lVar14 + 0x3a] == '\0')) {
      if ((uVar19 != 1) || (pxVar11->_rettype == '\x01')) {
        pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar10 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        cVar4 = '\x1e';
        goto LAB_001127ba;
      }
    }
    else {
LAB_0011274c:
      bVar15 = 1 < uVar19;
      if (pcVar9 != pcVar2) {
        lVar18 = 0;
        do {
          if ("namespace-uri"[lVar18] != pcVar2[lVar18]) goto LAB_001127cb;
          lVar18 = lVar18 + 1;
        } while (lVar14 != lVar18);
      }
      if (bVar15 || "namespace-uri"[lVar14] != '\0') {
LAB_001127cb:
        if (pcVar9 != pcVar2) {
          lVar18 = 0;
          do {
            if ("normalize-space"[lVar18] != pcVar2[lVar18]) goto LAB_00112a31;
            lVar18 = lVar18 + 1;
          } while (lVar14 != lVar18);
        }
        if (!bVar15 && "normalize-space"[lVar14] == '\0') {
          pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar10 == (xpath_ast_node *)0x0) {
            return (xpath_ast_node *)0x0;
          }
          bVar5 = uVar19 == 0 ^ 0x2b;
LAB_00112d17:
          pxVar10->_type = bVar5;
          pxVar10->_rettype = '\x03';
          pxVar10->_axis = '\0';
          pxVar10->_test = '\0';
          goto LAB_00112d26;
        }
LAB_00112a31:
        if (pcVar9 != pcVar2) {
          lVar18 = 0;
          do {
            if ("not"[lVar18] != pcVar2[lVar18]) goto LAB_00112b75;
            lVar18 = lVar18 + 1;
          } while (lVar14 != lVar18);
        }
        if ((uVar19 == 1) && ("not"[lVar14] == '\0')) {
          pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar10 == (xpath_ast_node *)0x0) {
            return (xpath_ast_node *)0x0;
          }
          pxVar10->_type = '.';
          pxVar10->_rettype = '\x04';
          pxVar10->_axis = '\0';
          pxVar10->_test = '\0';
          goto LAB_00112be3;
        }
LAB_00112b75:
        if (pcVar9 != pcVar2) {
          lVar18 = 0;
          do {
            if ("expr->rettype() == xpath_type_number"[lVar18 + 0x1e] != pcVar2[lVar18])
            goto switchD_00112213_caseD_64;
            lVar18 = lVar18 + 1;
          } while (lVar14 != lVar18);
        }
        if (!bVar15 && "expr->rettype() == xpath_type_number"[lVar14 + 0x1e] == '\0') {
          pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar10 == (xpath_ast_node *)0x0) {
            return (xpath_ast_node *)0x0;
          }
          bVar5 = uVar19 == 0 ^ 0x33;
          goto LAB_00112bd4;
        }
        break;
      }
      if ((uVar19 != 1) || (pxVar11->_rettype == '\x01')) {
        pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar10 == (xpath_ast_node *)0x0) {
          return (xpath_ast_node *)0x0;
        }
        cVar4 = '\x1c';
        goto LAB_001127ba;
      }
    }
LAB_00112db4:
    pcVar17 = "Function has to be applied to node set";
    break;
  case 'p':
    lVar14 = (long)pcVar9 - (long)pcVar2;
    if (lVar14 != 0) {
      lVar18 = 0;
      do {
        if ("position"[lVar18] != pcVar2[lVar18]) goto switchD_00112213_caseD_64;
        lVar18 = lVar18 + 1;
      } while (lVar14 != lVar18);
    }
    if ((uVar19 == 0) && ("position"[lVar14] == '\0')) {
      pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar10 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar10->_type = '\x16';
      pxVar10->_rettype = '\x02';
      pxVar10->_axis = '\0';
      pxVar10->_test = '\0';
      goto LAB_00112736;
    }
    break;
  case 'r':
    lVar14 = (long)pcVar9 - (long)pcVar2;
    if (lVar14 != 0) {
      lVar18 = 0;
      do {
        if ("round"[lVar18] != pcVar2[lVar18]) goto switchD_00112213_caseD_64;
        lVar18 = lVar18 + 1;
      } while (lVar14 != lVar18);
    }
    if ((uVar19 == 1) && ("round"[lVar14] == '\0')) {
      pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar10 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar10->_type = '7';
      pxVar10->_rettype = '\x02';
      pxVar10->_axis = '\0';
      pxVar10->_test = '\0';
      goto LAB_00112519;
    }
    break;
  case 's':
    lVar14 = (long)pcVar9 - (long)pcVar2;
    if (lVar14 != 0) {
      lVar18 = 0;
      do {
        if ("exponent_string"[lVar18 + 9] != pcVar2[lVar18]) goto LAB_0011296c;
        lVar18 = lVar18 + 1;
      } while (lVar14 != lVar18);
    }
    if ((uVar19 < 2) && ("exponent_string"[lVar14 + 9] == '\0')) {
      pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar10 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      cVar4 = ' ';
LAB_001127ba:
      cVar4 = cVar4 - (uVar19 == 0);
LAB_001127bc:
      pxVar10->_type = cVar4;
      pxVar10->_rettype = '\x03';
      pxVar10->_axis = '\0';
    }
    else {
LAB_0011296c:
      if (pcVar9 != pcVar2) {
        lVar18 = 0;
        do {
          if ("string-length"[lVar18] != pcVar2[lVar18]) goto LAB_001129c8;
          lVar18 = lVar18 + 1;
        } while (lVar14 != lVar18);
      }
      if (1 < uVar19 || "string-length"[lVar14] != '\0') {
LAB_001129c8:
        if (pcVar9 != pcVar2) {
          lVar18 = 0;
          do {
            if ("starts-with"[lVar18] != pcVar2[lVar18]) goto LAB_00112c04;
            lVar18 = lVar18 + 1;
          } while (lVar14 != lVar18);
        }
        if ((uVar19 == 2) && ("starts-with"[lVar14] == '\0')) {
          pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar10 == (xpath_ast_node *)0x0) {
            return (xpath_ast_node *)0x0;
          }
          pxVar10->_type = '\"';
          pxVar10->_rettype = '\x04';
          pxVar10->_axis = '\0';
          pxVar10->_test = '\0';
        }
        else {
LAB_00112c04:
          local_59 = uVar19 == 2;
          if (pcVar9 != pcVar2) {
            lVar18 = 0;
            do {
              if ("substring-before"[lVar18] != pcVar2[lVar18]) goto LAB_00112c62;
              lVar18 = lVar18 + 1;
            } while (lVar14 != lVar18);
          }
          if (local_59 && "substring-before"[lVar14] == '\0') {
            pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
            if (pxVar10 == (xpath_ast_node *)0x0) {
              return (xpath_ast_node *)0x0;
            }
            pxVar10->_type = '$';
            pxVar10->_rettype = '\x03';
            pxVar10->_axis = '\0';
            pxVar10->_test = '\0';
          }
          else {
LAB_00112c62:
            if (pcVar9 != pcVar2) {
              lVar18 = 0;
              do {
                if ("substring-after"[lVar18] != pcVar2[lVar18]) goto LAB_00112cbd;
                lVar18 = lVar18 + 1;
              } while (lVar14 != lVar18);
            }
            if (!local_59 || "substring-after"[lVar14] != '\0') {
LAB_00112cbd:
              if (pcVar9 != pcVar2) {
                lVar18 = 0;
                do {
                  if ("substring"[lVar18] != pcVar2[lVar18]) goto LAB_00112d45;
                  lVar18 = lVar18 + 1;
                } while (lVar14 != lVar18);
              }
              if (((uVar19 & 0xfffffffffffffffe) == 2) && ("substring"[lVar14] == '\0')) {
                pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
                if (pxVar10 == (xpath_ast_node *)0x0) {
                  return (xpath_ast_node *)0x0;
                }
                bVar5 = local_59 ^ 0x27;
                goto LAB_00112d17;
              }
LAB_00112d45:
              if (pcVar9 != pcVar2) {
                lVar18 = 0;
                do {
                  if ("sum"[lVar18] != pcVar2[lVar18]) goto switchD_00112213_caseD_64;
                  lVar18 = lVar18 + 1;
                } while (lVar14 != lVar18);
              }
              if ((uVar19 == 1) && ("sum"[lVar14] == '\0')) {
                if (pxVar11->_rettype != '\x01') goto LAB_00112db4;
                pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
                if (pxVar10 == (xpath_ast_node *)0x0) {
                  return (xpath_ast_node *)0x0;
                }
                pxVar10->_type = '4';
                pxVar10->_rettype = '\x02';
                pxVar10->_axis = '\0';
                pxVar10->_test = '\0';
                goto LAB_00112be3;
              }
              break;
            }
            pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
            if (pxVar10 == (xpath_ast_node *)0x0) {
              return (xpath_ast_node *)0x0;
            }
            pxVar10->_type = '%';
            pxVar10->_rettype = '\x03';
            pxVar10->_axis = '\0';
            pxVar10->_test = '\0';
          }
        }
        goto LAB_00112d26;
      }
      pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar10 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      bVar5 = uVar19 == 0 ^ 0x29;
LAB_00112bd4:
      pxVar10->_type = bVar5;
      pxVar10->_rettype = '\x02';
      pxVar10->_axis = '\0';
    }
    pxVar10->_test = '\0';
LAB_00112be3:
    pxVar10->_left = pxVar11;
LAB_00112bec:
    pxVar10->_right = (xpath_ast_node *)0x0;
    pxVar10->_next = (xpath_ast_node *)0x0;
LAB_00111fba:
    lVar16 = (this->_lexer)._cur_lexeme;
    while (lVar16 == lex_open_square_brace) {
      xpath_lexer::next(this_00);
      if (pxVar10->_rettype != '\x01') {
        pxVar12 = this->_result;
        pcVar17 = "Predicate has to be applied to node set";
        goto LAB_00112107;
      }
      pxVar8 = parse_expression(this,0);
      if (pxVar8 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar11 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar11 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar11->_type = '\x11';
      pxVar11->_rettype = '\x01';
      pxVar11->_axis = '\0';
      pxVar11->_test = '\0';
      pxVar11->_left = pxVar10;
      pxVar11->_right = pxVar8;
      pxVar11->_next = (xpath_ast_node *)0x0;
      if ((this->_lexer)._cur_lexeme != lex_close_square_brace) {
        pxVar12 = this->_result;
        pcVar17 = "Expected \']\' to match an opening \'[\'";
        goto LAB_00112107;
      }
      xpath_lexer::next(this_00);
      pxVar10 = pxVar11;
      lVar16 = (this->_lexer)._cur_lexeme;
    }
    if (lVar16 != lex_double_slash) {
      if (lVar16 != lex_slash) {
        return pxVar10;
      }
      xpath_lexer::next(this_00);
      pxVar8 = pxVar10;
LAB_001120bc:
      pxVar8 = parse_relative_location_path(this,pxVar8);
      return pxVar8;
    }
    xpath_lexer::next(this_00);
    if (pxVar10->_rettype == '\x01') {
      pxVar8 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar8 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar8->_type = '8';
      pxVar8->_rettype = '\x01';
      pxVar8->_axis = '\x05';
      pxVar8->_test = '\x02';
      pxVar8->_left = pxVar10;
      (pxVar8->_data).string = (char_t *)0x0;
      pxVar8->_right = (xpath_ast_node *)0x0;
      pxVar8->_next = (xpath_ast_node *)0x0;
      goto LAB_001120bc;
    }
    pxVar12 = this->_result;
    pcVar17 = "Step has to be applied to node set";
LAB_00112107:
    pxVar12->error = pcVar17;
    goto LAB_0011210a;
  case 't':
    lVar14 = (long)pcVar9 - (long)pcVar2;
    if (lVar14 != 0) {
      lVar18 = 0;
      do {
        if ("translate"[lVar18] != pcVar2[lVar18]) goto LAB_001126d8;
        lVar18 = lVar18 + 1;
      } while (lVar14 != lVar18);
    }
    if ((uVar19 == 3) && ("translate"[lVar14] == '\0')) {
      pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar10 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar10->_type = ',';
      pxVar10->_rettype = '\x03';
      pxVar10->_axis = '\0';
      pxVar10->_test = '\0';
      pxVar10->_left = pxVar11;
      goto LAB_00112d2f;
    }
LAB_001126d8:
    if (pcVar9 != pcVar2) {
      lVar18 = 0;
      do {
        if ("true"[lVar18] != pcVar2[lVar18]) goto switchD_00112213_caseD_64;
        lVar18 = lVar18 + 1;
      } while (lVar14 != lVar18);
    }
    if ((uVar19 == 0) && ("true"[lVar14] == '\0')) {
      pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar10 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar10->_type = '/';
      pxVar10->_rettype = '\x04';
      pxVar10->_axis = '\0';
      pxVar10->_test = '\0';
      goto LAB_00112736;
    }
  }
switchD_00112213_caseD_64:
  pxVar12 = this->_result;
  pxVar12->error = pcVar17;
LAB_0011210a:
  pxVar12->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
  return (xpath_ast_node *)0x0;
}

Assistant:

xpath_ast_node* parse_path_or_unary_expression()
		{
			// Clarification.
			// PathExpr begins with either LocationPath or FilterExpr.
			// FilterExpr begins with PrimaryExpr
			// PrimaryExpr begins with '$' in case of it being a variable reference,
			// '(' in case of it being an expression, string literal, number constant or
			// function call.
			if (_lexer.current() == lex_var_ref || _lexer.current() == lex_open_brace ||
				_lexer.current() == lex_quoted_string || _lexer.current() == lex_number ||
				_lexer.current() == lex_string)
			{
				if (_lexer.current() == lex_string)
				{
					// This is either a function call, or not - if not, we shall proceed with location path
					const char_t* state = _lexer.state();

					while (PUGI__IS_CHARTYPE(*state, ct_space)) ++state;

					if (*state != '(')
						return parse_location_path();

					// This looks like a function call; however this still can be a node-test. Check it.
					if (parse_node_test_type(_lexer.contents()) != nodetest_none)
						return parse_location_path();
				}

				xpath_ast_node* n = parse_filter_expression();
				if (!n) return 0;

				if (_lexer.current() == lex_slash || _lexer.current() == lex_double_slash)
				{
					lexeme_t l = _lexer.current();
					_lexer.next();

					if (l == lex_double_slash)
					{
						if (n->rettype() != xpath_type_node_set)
							return error("Step has to be applied to node set");

						n = alloc_node(ast_step, n, axis_descendant_or_self, nodetest_type_node, 0);
						if (!n) return 0;
					}

					// select from location path
					return parse_relative_location_path(n);
				}

				return n;
			}
			else if (_lexer.current() == lex_minus)
			{
				_lexer.next();

				// precedence 7+ - only parses union expressions
				xpath_ast_node* n = parse_expression(7);
				if (!n) return 0;

				return alloc_node(ast_op_negate, xpath_type_number, n);
			}
			else
			{
				return parse_location_path();
			}
		}